

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenarioCollection.h
# Opt level: O1

void __thiscall
gurkenlaeufer::ScenarioCollection::appendScenario(ScenarioCollection *this,Scenario *scenario)

{
  list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *plVar1;
  bool bVar2;
  _List_iterator<gurkenlaeufer::Step> __it;
  _Iter_pred<gurkenlaeufer::ScenarioCollection::appendScenario(gurkenlaeufer::Scenario)::_lambda(gurkenlaeufer::Step_const&)_1_>
  local_29;
  
  plVar1 = &scenario->tags;
  __it._M_node = (scenario->tags).
                 super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl
                 ._M_node.super__List_node_base._M_next;
  if (__it._M_node != (_List_node_base *)plVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<gurkenlaeufer::ScenarioCollection::appendScenario(gurkenlaeufer::Scenario)::{lambda(gurkenlaeufer::Step_const&)#1}>
              ::operator()(&local_29,__it);
      if (bVar2) break;
      __it._M_node = (__it._M_node)->_M_next;
    } while (__it._M_node != (_List_node_base *)plVar1);
  }
  if ((_List_node_base *)plVar1 == __it._M_node) {
    std::__cxx11::list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::
    _M_insert<gurkenlaeufer::Scenario>(&this->_scenarios,(iterator)&this->_scenarios,scenario);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Ignore scenario ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(scenario->description)._M_dataplus._M_p,
               (scenario->description)._M_string_length);
  }
  return;
}

Assistant:

void appendScenario(Scenario scenario)
    {
        if (scenario.tags.end() != std::find_if(scenario.tags.begin(), scenario.tags.end(), [](const Step& step) {
            if (detail::toLower(step.step) == "@ignore") {
                return true;
            }
            return false; })) {
            std::cout << "Ignore scenario " << scenario.description;
            return;
        }
        _scenarios.emplace_back(std::move(scenario));
    }